

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::calcGamma
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *QDot,MatrixNd *GSys,
          VectorNd *gammaSysUpd,ConstraintCache *cache,bool updateKinematics)

{
  byte bVar1;
  uint uVar2;
  reference pvVar3;
  Scalar *pSVar4;
  Vector3d *in_RDX;
  long in_RDI;
  Model *in_R9;
  ReturnType RVar5;
  double dVar6;
  long in_stack_00000008;
  byte in_stack_00000010;
  uint i;
  MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_fffffffffffffce8;
  undefined4 uVar9;
  SpatialVector_t *pSVar7;
  Vector3d *pVVar8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *other;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffd10;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd6b;
  uint in_stack_fffffffffffffd6c;
  VectorNd *in_stack_fffffffffffffd70;
  Model *in_stack_fffffffffffffd78;
  SpatialVector *in_stack_fffffffffffffe20;
  SpatialVector *in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe47;
  Vector3d *in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe54;
  VectorNd *in_stack_fffffffffffffe58;
  VectorNd *in_stack_fffffffffffffe60;
  Model *in_stack_fffffffffffffe68;
  uint local_17c;
  SpatialVector *in_stack_fffffffffffffeb0;
  SpatialTransform *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffeff;
  Vector3d *in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff0c;
  VectorNd *in_stack_ffffffffffffff10;
  Model *in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffffab;
  uint in_stack_ffffffffffffffac;
  VectorNd *in_stack_ffffffffffffffb0;
  VectorNd *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  
  bVar1 = in_stack_00000010 & 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  CalcBodyToBaseCoordinates
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  Vector3_t::operator=
            ((Vector3_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (Vector3_t *)in_stack_fffffffffffffce8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             (bool)in_stack_fffffffffffffd6b);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffce8);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffce8);
  Matrix3_t::operator=
            ((Matrix3_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             in_stack_fffffffffffffce8);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  pSVar7 = (SpatialVector_t *)CONCAT44(uVar9,(uint)(bVar1 & 1));
  CalcPointVelocity6D(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                      (bool)in_stack_fffffffffffffe47);
  SpatialVector_t::operator=
            ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),pSVar7
            );
  uVar9 = (undefined4)((ulong)pSVar7 >> 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),1);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),1);
  pSVar7 = (SpatialVector_t *)CONCAT44(uVar9,(uint)(bVar1 & 1));
  CalcPointVelocity6D(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,
                      (bool)in_stack_fffffffffffffe47);
  SpatialVector_t::operator=
            ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),pSVar7
            );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  pvVar3 = std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(in_RDI + 0x50),0);
  pVVar8 = &pvVar3->r;
  uVar2 = (uint)(bVar1 & 1);
  CalcPointAcceleration6D
            (in_R9,(VectorNd *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_RDX,
             (bool)in_stack_ffffffffffffffab);
  SpatialVector_t::operator=
            ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,uVar2),(SpatialVector_t *)pVVar8)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),1);
  pvVar3 = std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(in_RDI + 0x50),1);
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           *)&pvVar3->r;
  uVar2 = (uint)(bVar1 & 1);
  CalcPointAcceleration6D
            (in_R9,(VectorNd *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_RDX,
             (bool)in_stack_ffffffffffffffab);
  SpatialVector_t::operator=
            ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,uVar2),(SpatialVector_t *)other);
  for (local_17c = 0; local_17c < *(uint *)(in_RDI + 0x30); local_17c = local_17c + 1) {
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0xd8),(ulong)local_17c);
    Math::SpatialTransform::apply(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    SpatialVector_t::operator=
              ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,uVar2),(SpatialVector_t *)other
              );
    Math::crossm(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    SpatialVector_t::operator=
              ((SpatialVector_t *)CONCAT44(in_stack_fffffffffffffcf4,uVar2),(SpatialVector_t *)other
              );
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-
              (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
            dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       CONCAT44(in_stack_fffffffffffffcf4,uVar2),other);
    in_stack_fffffffffffffd18 =
         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)((ulong)RVar5 ^ 0x8000000000000000);
    in_stack_fffffffffffffd10 =
         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(in_stack_00000008 + 0x440);
    Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator-
              (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
            dot<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                      ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                       CONCAT44(in_stack_fffffffffffffcf4,uVar2),other);
    dVar6 = (double)in_stack_fffffffffffffd18 - RVar5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffcf4,uVar2),(Index)other);
    *pSVar4 = dVar6;
  }
  return;
}

Assistant:

void LoopConstraint::calcGamma(  Model &model,
                  const double time,
                  const Math::VectorNd &Q,
                  const Math::VectorNd &QDot,
                  const Math::MatrixNd &GSys,
                  Math::VectorNd &gammaSysUpd,
                  ConstraintCache &cache,
                  bool updateKinematics)
{
  //Please refer to Ch. 8 of Featherstone's Rigid Body Dynamics text for details

  // Express the constraint axis in the base frame.
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  // Compute the spatial velocities of the two constrained bodies.
  //vel_p
  cache.svecA = CalcPointVelocity6D(model,Q,QDot,bodyIds[0],bodyFrames[0].r,
                                    updateKinematics);

  //vel_s
  cache.svecB = CalcPointVelocity6D(model,Q,QDot,bodyIds[1],bodyFrames[1].r,
                                    updateKinematics);

  // Compute the velocity product accelerations. These correspond to the
  // accelerations that the bodies would have if q ddot were 0. If this
  // confuses you please see Sec. 8.2 of Featherstone's Rigid Body Dynamics text

  //acc_p
  cache.svecC = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[0],bodyFrames[0].r,updateKinematics);
  //acc_s
  cache.svecD = CalcPointAcceleration6D(model,Q,QDot,cache.vecNZeros,
                                        bodyIds[1],bodyFrames[1].r,updateKinematics);

  for(unsigned int i=0; i<sizeOfConstraint;++i){

    cache.svecE = cache.stA.apply(T[i]);

    cache.svecF = crossm(cache.svecA, cache.svecE);

    gammaSysUpd[rowInSystem+i] =
        -cache.svecE.dot(cache.svecD-cache.svecC)
        -cache.svecF.dot(cache.svecB-cache.svecA);
  }

}